

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O2

StrHash hash_dense_def(uint64_t seed,StrHash h,char *str,MSize len)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int *piVar4;
  uint uVar5;
  int *piVar6;
  int *piVar7;
  
  uVar2 = (uint)(seed >> 0x20) ^ h;
  uVar3 = uVar2 << 4;
  uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
          (uVar3 | uVar2 >> 0x1c) << 0x18;
  if (0xc < len) {
    piVar6 = (int *)(str + -0xc);
    piVar1 = (int *)str;
    piVar7 = (int *)(str + ((ulong)len - 0xc));
    do {
      piVar4 = piVar1;
      uVar3 = uVar3 + piVar7[1];
      h = (h + piVar7[2] ^ uVar3) - (uVar3 * 0x4000 | uVar3 >> 0x12);
      uVar2 = ((int)seed + *piVar7 ^ h) - (h * 0x800 | h >> 0x15);
      seed = (uint64_t)uVar2;
      uVar3 = (uVar3 ^ uVar2) - (uVar2 * 0x2000000 | uVar2 >> 7);
      piVar6 = piVar6 + 3;
      piVar1 = piVar4 + 3;
      piVar7 = piVar4;
    } while (piVar6 < str + ((ulong)len - 0xc));
    uVar5 = (h ^ uVar3) - (uVar3 * 0x10000 | uVar3 >> 0x10);
    uVar2 = (uVar2 ^ uVar5) - (uVar5 * 0x10 | uVar5 >> 0x1c);
    uVar3 = (uVar3 ^ uVar2) - (uVar2 * 0x4000 | uVar2 >> 0x12);
  }
  return uVar3;
}

Assistant:

static LJ_NOINLINE StrHash hash_dense_def(uint64_t seed, StrHash h,
					  const char *str, MSize len)
{
  StrHash b = lj_bswap(lj_rol(h ^ (StrHash)(seed >> 32), 4));
  if (len > 12) {
    StrHash a = (StrHash)seed;
    const char *pe = str+len-12, *p = pe, *q = str;
    do {
      a += lj_getu32(p);
      b += lj_getu32(p+4);
      h += lj_getu32(p+8);
      p = q; q += 12;
      h ^= b; h -= lj_rol(b, 14);
      a ^= h; a -= lj_rol(h, 11);
      b ^= a; b -= lj_rol(a, 25);
    } while (p < pe);
    h ^= b; h -= lj_rol(b, 16);
    a ^= h; a -= lj_rol(h, 4);
    b ^= a; b -= lj_rol(a, 14);
  }
  return b;
}